

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  byte *limit;
  bool bVar1;
  byte *pbVar2;
  FT_Int FVar3;
  FT_Fixed FVar4;
  long lVar5;
  byte *local_48;
  PS_Parser local_40;
  uint local_34;
  
  ps_parser_skip_spaces(parser);
  limit = parser->limit;
  local_48 = parser->cursor;
  FVar3 = 0;
  if (limit <= local_48) goto LAB_002047f1;
  if (*local_48 == 0x5b) {
    local_34 = 0x5d;
LAB_00204758:
    local_48 = local_48 + 1;
    bVar1 = false;
  }
  else {
    if (*local_48 == 0x7b) {
      local_34 = 0x7d;
      goto LAB_00204758;
    }
    local_34 = 0;
    bVar1 = true;
  }
  lVar5 = 0;
  local_40 = parser;
  do {
    if ((limit <= local_48) || (skip_spaces(&local_48,limit), pbVar2 = local_48, limit <= local_48))
    break;
    if (local_34 == *local_48) {
      local_48 = local_48 + 1;
      break;
    }
    if (max_coords <= lVar5 && coords != (FT_Short *)0x0) break;
    FVar4 = PS_Conv_ToFixed(&local_48,limit,0);
    if (coords != (FT_Short *)0x0) {
      coords[lVar5] = (FT_Short)((ulong)FVar4 >> 0x10);
    }
    if (pbVar2 == local_48) {
      FVar3 = -1;
      parser = local_40;
      goto LAB_002047f1;
    }
    lVar5 = lVar5 + 1;
  } while (!bVar1);
  FVar3 = (FT_Int)lVar5;
  parser = local_40;
LAB_002047f1:
  parser->cursor = local_48;
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }